

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzer.cpp
# Opt level: O0

U64 __thiscall USBAnalyzer::SendPacketToHandler(USBAnalyzer *this,USBPacket *pckt)

{
  iterator this_00;
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  pointer ppVar4;
  __enable_if_t<is_constructible<value_type,_pair<USBPipe,_USBControlTransferPacketHandler>_>::value,_pair<iterator,_bool>_>
  _Var5;
  USBControlTransferPacketHandler local_208;
  pair<USBAnalyzer::USBPipe,_USBControlTransferPacketHandler> local_128;
  _Base_ptr local_40;
  undefined1 local_38;
  _Self local_30;
  _Self local_28;
  iterator srch;
  USBPacket *pckt_local;
  USBAnalyzer *this_local;
  
  srch._M_node = (_Base_ptr)pckt;
  bVar1 = USBPacket::IsTokenPacket(pckt);
  if (bVar1) {
    bVar2 = USBPacket::GetAddress((USBPacket *)srch._M_node);
    (this->mCtrlTransLastPipe).addr = (uint)bVar2;
    bVar2 = USBPacket::GetEndpoint((USBPacket *)srch._M_node);
    (this->mCtrlTransLastPipe).endp = (uint)bVar2;
  }
  this_00._M_node = srch._M_node;
  if ((((this->mCtrlTransLastPipe).endp == 0) && (srch._M_node[2]._M_color != 0xa5)) &&
     (srch._M_node[2]._M_color != 0x3c)) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<USBAnalyzer::USBPipe,_USBControlTransferPacketHandler,_std::less<USBAnalyzer::USBPipe>,_std::allocator<std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>_>_>
         ::find(&this->mCtrlTransPacketHandlers,&this->mCtrlTransLastPipe);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<USBAnalyzer::USBPipe,_USBControlTransferPacketHandler,_std::less<USBAnalyzer::USBPipe>,_std::allocator<std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>_>_>
         ::end(&this->mCtrlTransPacketHandlers);
    bVar1 = std::operator==(&local_28,&local_30);
    if (bVar1) {
      local_208.mAddress = 0;
      local_208._212_4_ = 0;
      local_208.mResults = (USBAnalyzerResults *)0x0;
      local_208.mCtrlTransParser.mHidUsagePageStack.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.mCtrlTransParser.mHidUsagePageStack.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.mCtrlTransParser.mHidIndentLevel = 0;
      local_208.mCtrlTransParser.mHidItemCnt = 0;
      local_208.mCtrlTransParser.mHidUsagePageStack.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.mCtrlTransParser.mInterfaceClasses._M_t._M_impl.super__Rb_tree_header._M_node_count
           = 0;
      local_208.mCtrlTransParser.mHidRepDescItem[0] = '\0';
      local_208.mCtrlTransParser.mHidRepDescItem[1] = '\0';
      local_208.mCtrlTransParser.mHidRepDescItem[2] = '\0';
      local_208.mCtrlTransParser.mHidRepDescItem[3] = '\0';
      local_208.mCtrlTransParser.mHidRepDescItem[4] = '\0';
      local_208.mCtrlTransParser.mHidRepDescBytes = '\0';
      local_208.mCtrlTransParser._158_2_ = 0;
      local_208.mCtrlTransParser.mInterfaceClasses._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0x0;
      local_208.mCtrlTransParser.mInterfaceClasses._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x0;
      local_208.mCtrlTransParser.mInterfaceClasses._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      local_208.mCtrlTransParser.mInterfaceClasses._M_t._M_impl.super__Rb_tree_header._M_header.
      _4_4_ = 0;
      local_208.mCtrlTransParser.mInterfaceClasses._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      local_208.mCtrlTransParser.mInterfaceNumber = '\0';
      local_208.mCtrlTransParser._97_7_ = 0;
      local_208.mCtrlTransParser.mInterfaceClasses._M_t._M_impl._0_8_ = 0;
      local_208.mCtrlTransParser.pPacket = (USBPacket *)0x0;
      local_208.mCtrlTransParser.mPacketOffset = 0;
      local_208.mCtrlTransParser.mPacketDataBytes = 0;
      local_208.mCtrlTransParser.utf16StringDescriptor.field_2._M_allocated_capacity = 0;
      local_208.mCtrlTransParser.utf16StringDescriptor.field_2._8_8_ = 0;
      local_208.mCtrlTransParser.utf16StringDescriptor._M_dataplus._M_p = (pointer)0x0;
      local_208.mCtrlTransParser.utf16StringDescriptor._M_string_length = 0;
      local_208.mCtrlTransParser.mAddress = '\0';
      local_208.mCtrlTransParser._33_1_ = 0;
      local_208.mCtrlTransParser.mRequest.bmRequestType = '\0';
      local_208.mCtrlTransParser.mRequest.bRequest = '\0';
      local_208.mCtrlTransParser.mRequest.wValue = 0;
      local_208.mCtrlTransParser.mRequest.wIndex = 0;
      local_208.mCtrlTransParser.mRequest.wLength = 0;
      local_208.mCtrlTransParser._42_6_ = 0;
      local_208.mCtrlTransParser.mLeftover = 0;
      local_208.mCtrlTransParser._20_4_ = 0;
      local_208.mCtrlTransParser.pResults = (USBAnalyzerResults *)0x0;
      local_208.mCtrlTransParser.mDescBytes = 0;
      local_208.mCtrlTransParser.mDescType = DT_Undefined;
      local_208.mCtrlTransParser.mDescSubtype = DST_HEADER;
      local_208.mCtrlTransParser.mParsedOffset = 0;
      local_208.mCtrlTransLastReceived = CTS_SetupToken;
      local_208.mCtrlTransRequest = GET_STATUS;
      local_208.mCtrlTransDeviceToHost = false;
      local_208._9_7_ = 0;
      USBControlTransferPacketHandler::USBControlTransferPacketHandler(&local_208);
      std::make_pair<USBAnalyzer::USBPipe&,USBControlTransferPacketHandler>
                (&local_128,&this->mCtrlTransLastPipe,&local_208);
      _Var5 = std::
              map<USBAnalyzer::USBPipe,USBControlTransferPacketHandler,std::less<USBAnalyzer::USBPipe>,std::allocator<std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>>>
              ::insert<std::pair<USBAnalyzer::USBPipe,USBControlTransferPacketHandler>>
                        ((map<USBAnalyzer::USBPipe,USBControlTransferPacketHandler,std::less<USBAnalyzer::USBPipe>,std::allocator<std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>>>
                          *)&this->mCtrlTransPacketHandlers,&local_128);
      local_40 = (_Base_ptr)_Var5.first._M_node;
      local_38 = _Var5.second;
      local_28._M_node = local_40;
      std::pair<USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>::~pair(&local_128);
      USBControlTransferPacketHandler::~USBControlTransferPacketHandler(&local_208);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>_>
               ::operator->(&local_28);
      peVar3 = std::auto_ptr<USBAnalyzerResults>::get(&this->mResults);
      USBControlTransferPacketHandler::Init(&ppVar4->second,peVar3,(this->mCtrlTransLastPipe).addr);
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>_>
             ::operator->(&local_28);
    this_local = (USBAnalyzer *)
                 USBControlTransferPacketHandler::HandleControlTransfer
                           (&ppVar4->second,(USBPacket *)srch._M_node);
  }
  else {
    peVar3 = std::auto_ptr<USBAnalyzerResults>::get(&this->mResults);
    this_local = (USBAnalyzer *)
                 USBPacket::AddPacketFrames((USBPacket *)this_00._M_node,peVar3,FF_None);
  }
  return (U64)this_local;
}

Assistant:

U64 USBAnalyzer::SendPacketToHandler( USBPacket& pckt )
{
    if( pckt.IsTokenPacket() )
    {
        mCtrlTransLastPipe.addr = pckt.GetAddress();
        mCtrlTransLastPipe.endp = pckt.GetEndpoint();
    }

    // only control transfers and no SOF or PRE packets
    if( mCtrlTransLastPipe.endp == 0 && pckt.mPID != PID_SOF && pckt.mPID != PID_PRE )
    {
        // do we have this address/enpoint already?
        USBPipeHandler::iterator srch( mCtrlTransPacketHandlers.find( mCtrlTransLastPipe ) );

        // is this a new address?
        if( srch == mCtrlTransPacketHandlers.end() )
        {
            srch = mCtrlTransPacketHandlers.insert( std::make_pair( mCtrlTransLastPipe, USBControlTransferPacketHandler() ) ).first;
            srch->second.Init( mResults.get(), mCtrlTransLastPipe.addr );
        }

        return srch->second.HandleControlTransfer( pckt );
    }

    return pckt.AddPacketFrames( mResults.get() );
}